

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Block * __thiscall
soul::heart::Parser::getBlock(Parser *this,FunctionParseState *state,Identifier name)

{
  Block *pBVar1;
  Identifier *args;
  pool_ptr<soul::heart::Block> b;
  undefined1 local_58 [8];
  Ptr local_50;
  CompileMessage local_48;
  
  local_50.object = (SourceCodeText *)name.name;
  findBlock((Parser *)local_58,(FunctionParseState *)this,(Identifier)state);
  if (local_58 == (undefined1  [8])0x0) {
    Errors::cannotFind<soul::Identifier&>(&local_48,(Errors *)&local_50,args);
    (*(this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      )._vptr_Tokeniser[2])(this,&local_48);
    CompileMessage::~CompileMessage(&local_48);
  }
  pBVar1 = pool_ptr<soul::heart::Block>::operator*((pool_ptr<soul::heart::Block> *)local_58);
  return pBVar1;
}

Assistant:

heart::Block& getBlock (const FunctionParseState& state, Identifier name)
    {
        auto b = findBlock (state, name);

        if (b == nullptr)
            throwError (Errors::cannotFind (name));

        return *b;
    }